

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

string * __thiscall duckdb_re2::NFA::FormatCapture_abi_cxx11_(NFA *this,char **capture)

{
  long in_RDX;
  long in_RSI;
  string *in_RDI;
  int i;
  string *s;
  string local_70 [32];
  string local_50 [48];
  int local_20;
  undefined1 local_19;
  long local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)in_RDI);
  for (local_20 = 0; local_20 < *(int *)(in_RSI + 0xc); local_20 = local_20 + 2) {
    if (*(long *)(local_18 + (long)local_20 * 8) == 0) {
      std::__cxx11::string::operator+=((string *)in_RDI,"(?,?)");
    }
    else if (*(long *)(local_18 + (long)(local_20 + 1) * 8) == 0) {
      StringPrintf_abi_cxx11_
                ((char *)local_50,"(%td,?)",
                 *(long *)(local_18 + (long)local_20 * 8) - *(long *)(in_RSI + 0x18));
      std::__cxx11::string::operator+=((string *)in_RDI,local_50);
      std::__cxx11::string::~string(local_50);
    }
    else {
      StringPrintf_abi_cxx11_
                ((char *)local_70,"(%td,%td)",
                 *(long *)(local_18 + (long)local_20 * 8) - *(long *)(in_RSI + 0x18),
                 *(long *)(local_18 + 8 + (long)local_20 * 8) - *(long *)(in_RSI + 0x18));
      std::__cxx11::string::operator+=((string *)in_RDI,local_70);
      std::__cxx11::string::~string(local_70);
    }
  }
  return in_RDI;
}

Assistant:

std::string NFA::FormatCapture(const char** capture) {
  std::string s;
  for (int i = 0; i < ncapture_; i+=2) {
    if (capture[i] == NULL)
      s += "(?,?)";
    else if (capture[i+1] == NULL)
      s += StringPrintf("(%td,?)",
                        capture[i] - btext_);
    else
      s += StringPrintf("(%td,%td)",
                        capture[i] - btext_,
                        capture[i+1] - btext_);
  }
  return s;
}